

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcDeadReckoningFVW
          (DeadReckoningCalculator *this,WorldCoordinates *PositionOut,KFLOAT32 totalTimeSinceReset)

{
  Vector local_88;
  Vector local_70;
  WorldCoordinates local_58;
  WorldCoordinates local_38;
  
  DATA_TYPE::Vector::operator*(&local_70,&this->m_initLinearVelocity,totalTimeSinceReset);
  DATA_TYPE::WorldCoordinates::operator+(&local_58,&this->m_initPosition,&local_70);
  DATA_TYPE::Vector::operator*
            (&local_88,&this->m_initLinearAcceleration,
             (KFLOAT64)
             ((double)(float)totalTimeSinceReset * 0.5 * (double)(float)totalTimeSinceReset));
  DATA_TYPE::WorldCoordinates::operator+(&local_38,&local_58,&local_88);
  PositionOut->m_f64Z = local_38.m_f64Z;
  PositionOut->m_f64X = local_38.m_f64X;
  PositionOut->m_f64Y = local_38.m_f64Y;
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_38.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_88.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_58.super_DataTypeBase);
  DATA_TYPE::DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  return;
}

Assistant:

void DeadReckoningCalculator::calcDeadReckoningFVW( WorldCoordinates & PositionOut, const KFLOAT32 totalTimeSinceReset )
{
    /* Position */
    PositionOut = ( m_initPosition + ( m_initLinearVelocity * totalTimeSinceReset ) +
                    ( m_initLinearAcceleration * ( 0.5 * totalTimeSinceReset * totalTimeSinceReset ) ) );
}